

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blendshape.hpp
# Opt level: O0

vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_> *
eos::morphablemodel::load_blendshapes
          (vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
           *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  runtime_error *this;
  undefined1 local_370 [8];
  BinaryInputArchive input_archive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_228;
  ifstream file;
  string *filename_local;
  vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  *blendshapes;
  
  std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>::
  vector(__return_storage_ptr__);
  std::ifstream::ifstream(&local_228,(string *)filename,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    input_archive.itsStream._7_1_ = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_258,"Error opening given file: ",filename);
    std::runtime_error::runtime_error(this,(string *)&local_258);
    input_archive.itsStream._7_1_ = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cereal::BinaryInputArchive::BinaryInputArchive
            ((BinaryInputArchive *)local_370,(istream *)&local_228);
  cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::BinaryInputArchive,1u> *)local_370,__return_storage_ptr__);
  cereal::BinaryInputArchive::~BinaryInputArchive((BinaryInputArchive *)local_370);
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Blendshape> load_blendshapes(std::string filename)
{
    std::vector<Blendshape> blendshapes;

    std::ifstream file(filename, std::ios::binary);
    if (!file)
    {
        throw std::runtime_error("Error opening given file: " + filename);
    }
    cereal::BinaryInputArchive input_archive(file);
    input_archive(blendshapes);

    return blendshapes;
}